

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::VertexCubeTextureCase::init(VertexCubeTextureCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderContext *renderCtx;
  long lVar2;
  RenderTarget *pRVar3;
  ShaderProgram *this_00;
  TextureCube *this_01;
  undefined8 extraout_RAX;
  Vec4 *extraout_RAX_00;
  Vec4 *extraout_RAX_01;
  NotSupportedError *pNVar4;
  Vec4 *pVVar5;
  int i;
  int levelNdx;
  uint uVar6;
  long lVar7;
  pointer_____offset_0x10___ *ppuVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int levelNdx_1;
  Vector<float,_4> VVar12;
  Vec4 *local_1c0;
  RGBA local_1b0;
  RGBA local_1ac;
  Vec4 cBias;
  Vec4 local_188;
  Vec4 cScale;
  Vector<float,_4> local_150;
  Vec4 local_140;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  Vector<float,_4> local_110;
  GLint maxVertexTextures;
  Vector<float,_4> local_f0 [12];
  
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar3->m_numSamples != 0) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxVertexTextures,"MSAA config not supported by this test",
               (allocator<char> *)&cBias);
    tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)&maxVertexTextures);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cBias,
             "attribute highp vec2 a_position;\nattribute highp vec3 a_texCoord;\nuniform highp samplerCube u_texture;\nuniform highp float u_lod;\nvarying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureCubeLod(u_texture, a_texCoord, u_lod);\n}\n"
             ,(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cScale,
             "varying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_FragColor = v_color;\n}\n",
             (allocator<char> *)&local_130);
  glu::makeVtxFragSources((ProgramSources *)&maxVertexTextures,(string *)&cBias,(string *)&cScale);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)&maxVertexTextures);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources((ProgramSources *)&maxVertexTextures);
  std::__cxx11::string::~string((string *)&cScale);
  std::__cxx11::string::~string((string *)&cBias);
  if ((this->m_program->m_program).m_info.linkOk == true) {
    for (lVar10 = 0x12; lVar10 != 0x14; lVar10 = lVar10 + 1) {
      this_01 = (TextureCube *)operator_new(0x180);
      glu::TextureCube::TextureCube
                (this_01,((this->super_TestCase).m_context)->m_renderCtx,0x1907,0x1401,0x20);
      (&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode)[lVar10] =
           (_func_int **)this_01;
    }
    tcu::getTextureFormatInfo
              ((TextureFormatInfo *)&maxVertexTextures,&(this->m_textures[0]->m_refTexture).m_format
              );
    tcu::Vector<float,_4>::Vector(&cBias,(Vector<float,_4> *)&maxVertexTextures);
    VVar12 = tcu::operator-((tcu *)&cScale,local_f0,(Vector<float,_4> *)&maxVertexTextures);
    pVVar5 = (Vec4 *)CONCAT71((int7)((ulong)extraout_RAX >> 8),init()::gradients);
    if (init()::gradients == '\0') {
      pVVar5 = (Vec4 *)__cxa_guard_acquire(VVar12.m_data[0],VVar12.m_data[2],&init()::gradients);
      if ((int)pVVar5 != 0) {
        init::gradients[0][0].m_data[0] = _DAT_018011a0;
        init::gradients[0][0].m_data[1] = _UNK_018011a4;
        init::gradients[0][0].m_data[2] = _UNK_018011a8;
        init::gradients[0][0].m_data[3] = _UNK_018011ac;
        init::gradients[0][1].m_data[0] = _DAT_01801120;
        init::gradients[0][1].m_data[1] = _UNK_01801124;
        init::gradients[0][1].m_data[2] = _UNK_01801128;
        init::gradients[0][1].m_data[3] = _UNK_0180112c;
        init::gradients[1][0].m_data[0] = _DAT_018011b0;
        init::gradients[1][0].m_data[1] = _UNK_018011b4;
        init::gradients[1][0].m_data[2] = _UNK_018011b8;
        init::gradients[1][0].m_data[3] = _UNK_018011bc;
        init::gradients[1][1].m_data[0] = _DAT_01801120;
        init::gradients[1][1].m_data[1] = _UNK_01801124;
        init::gradients[1][1].m_data[2] = _UNK_01801128;
        init::gradients[1][1].m_data[3] = _UNK_0180112c;
        init::gradients[2][0].m_data[0] = _DAT_018011c0;
        init::gradients[2][0].m_data[1] = _UNK_018011c4;
        init::gradients[2][0].m_data[2] = _UNK_018011c8;
        init::gradients[2][0].m_data[3] = _UNK_018011cc;
        init::gradients[2][1].m_data[0] = _DAT_01801120;
        init::gradients[2][1].m_data[1] = _UNK_01801124;
        init::gradients[2][1].m_data[2] = _UNK_01801128;
        init::gradients[2][1].m_data[3] = _UNK_0180112c;
        init::gradients[3][0].m_data[0] = _DAT_018011d0;
        init::gradients[3][0].m_data[1] = _UNK_018011d4;
        init::gradients[3][0].m_data[2] = _UNK_018011d8;
        init::gradients[3][0].m_data[3] = _UNK_018011dc;
        init::gradients[3][1].m_data[0] = _DAT_01801120;
        init::gradients[3][1].m_data[1] = _UNK_01801124;
        init::gradients[3][1].m_data[2] = _UNK_01801128;
        init::gradients[3][1].m_data[3] = _UNK_0180112c;
        init::gradients[4][0].m_data[0] = _DAT_018011e0;
        init::gradients[4][0].m_data[1] = _UNK_018011e4;
        init::gradients[4][0].m_data[2] = _UNK_018011e8;
        init::gradients[4][0].m_data[3] = _UNK_018011ec;
        init::gradients[4][1].m_data[0] = _DAT_01675840;
        init::gradients[4][1].m_data[1] = _UNK_01675844;
        init::gradients[4][1].m_data[2] = _UNK_01675848;
        init::gradients[4][1].m_data[3] = _UNK_0167584c;
        init::gradients[5][0].m_data[0] = _DAT_018011f0;
        init::gradients[5][0].m_data[1] = _UNK_018011f4;
        init::gradients[5][0].m_data[2] = _UNK_018011f8;
        init::gradients[5][0].m_data[3] = _UNK_018011fc;
        init::gradients[5][1].m_data[0] = _DAT_01801120;
        init::gradients[5][1].m_data[1] = _UNK_01801124;
        init::gradients[5][1].m_data[2] = _UNK_01801128;
        init::gradients[5][1].m_data[3] = _UNK_0180112c;
        pVVar5 = (Vec4 *)__cxa_guard_release(&init()::gradients);
      }
    }
    for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
      lVar11 = 0;
      pVVar5 = init::gradients[lVar10] + 1;
      for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
        tcu::TextureCube::allocLevel(&this->m_textures[0]->m_refTexture,(CubeFace)lVar10,(int)lVar7)
        ;
        lVar2 = (long)(this->m_textures[0]->m_refTexture).m_access[lVar10].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        tcu::operator*((tcu *)&local_130,init::gradients[lVar10],&cScale);
        tcu::operator+((tcu *)&local_188,&local_130,&cBias);
        tcu::operator*((tcu *)&local_150,init::gradients[lVar10] + 1,&cScale);
        tcu::operator+((tcu *)&local_140,&local_150,&cBias);
        tcu::fillWithComponentGradients((PixelBufferAccess *)(lVar2 + lVar11),&local_188,&local_140)
        ;
        lVar11 = lVar11 + 0x28;
        pVVar5 = extraout_RAX_00;
      }
    }
    local_1c0 = (Vec4 *)0x0;
    iVar1 = 0;
    for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
      lVar7 = 0;
      uVar9 = 0xffffffff;
      uVar6 = 0;
      for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
        tcu::TextureCube::allocLevel
                  (&this->m_textures[1]->m_refTexture,(CubeFace)lVar10,(int)lVar11);
        local_1ac.m_value = uVar6 | 0xff000000;
        lVar2 = (long)(this->m_textures[1]->m_refTexture).m_access[lVar10].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        tcu::RGBA::toVec(&local_1ac);
        tcu::operator*((tcu *)&local_130,&local_140,&cScale);
        tcu::operator+((tcu *)&local_188,&local_130,&cBias);
        local_1b0.m_value = uVar9 | 0xff000000;
        tcu::RGBA::toVec(&local_1b0);
        tcu::operator*((tcu *)&local_110,&local_120,&cScale);
        tcu::operator+((tcu *)&local_150,&local_110,&cBias);
        tcu::fillWithGrid((PixelBufferAccess *)(lVar2 + lVar7),4,&local_188,&local_150);
        uVar6 = uVar6 + iVar1;
        uVar9 = uVar9 + (int)local_1c0;
        lVar7 = lVar7 + 0x28;
      }
      iVar1 = iVar1 + 0x71c71;
      pVVar5 = (Vec4 *)(ulong)((int)local_1c0 - 0x71c71);
      local_1c0 = pVVar5;
    }
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      glu::TextureCube::upload(this->m_textures[lVar10]);
      pVVar5 = extraout_RAX_01;
    }
    return (int)pVVar5;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  glwGetIntegerv(0x8b4c,&maxVertexTextures);
  pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if (maxVertexTextures < 1) {
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"Vertex texture image units not supported",
               glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fVertexTextureTests.cpp"
               ,0x307);
    ppuVar8 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::TestError::TestError
              ((TestError *)pNVar4,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fVertexTextureTests.cpp"
               ,0x309);
    ppuVar8 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(pNVar4,ppuVar8,tcu::Exception::~Exception);
}

Assistant:

void VertexCubeTextureCase::init (void)
{
	const char* const vertexShader =
		"attribute highp vec2 a_position;\n"
		"attribute highp vec3 a_texCoord;\n"
		"uniform highp samplerCube u_texture;\n"
		"uniform highp float u_lod;\n"
		"varying mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_color = textureCubeLod(u_texture, a_texCoord, u_lod);\n"
		"}\n";

	const char* const fragmentShader =
		"varying mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_FragColor = v_color;\n"
		"}\n";

	if (m_context.getRenderTarget().getNumSamples() != 0)
		throw tcu::NotSupportedError("MSAA config not supported by this test");

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShader, fragmentShader));

	if(!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;

		GLint maxVertexTextures;
		glGetIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTextures);

		if (maxVertexTextures < 1)
			throw tcu::NotSupportedError("Vertex texture image units not supported", "", __FILE__, __LINE__);
		else
			TCU_FAIL("Failed to compile shader");
	}

	// Make the textures.
	try
	{
		// Compute suitable power-of-two sizes (for mipmaps).
		const int texWidth		= 1 << deLog2Ceil32(MAX_CUBE_RENDER_WIDTH / 3 / 2);
		const int texHeight		= 1 << deLog2Ceil32(MAX_CUBE_RENDER_HEIGHT / 2 / 2);

		DE_ASSERT(texWidth == texHeight);
		DE_UNREF(texHeight);

		for (int i = 0; i < 2; i++)
		{
			DE_ASSERT(!m_textures[i]);
			m_textures[i] = new glu::TextureCube(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, texWidth);
		}

		const bool						mipmaps		= deIsPowerOfTwo32(texWidth) != DE_FALSE;
		const int						numLevels	= mipmaps ? deLog2Floor32(texWidth)+1 : 1;
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
		const Vec4						cBias		= fmtInfo.valueMin;
		const Vec4						cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Fill first with gradient texture.
		static const Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ Vec4(-1.0f, -1.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ Vec4( 0.0f, -1.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ Vec4(-1.0f,  0.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ Vec4(-1.0f, -1.0f,  0.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ Vec4(-1.0f, -1.0f, -1.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ Vec4( 0.0f,  0.0f,  0.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				m_textures[0]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0]*cScale + cBias, gradients[face][1]*cScale + cBias);
			}
		}

		// Fill second with grid texture.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				const deUint32 step		= 0x00ffffff / (numLevels*tcu::CUBEFACE_LAST);
				const deUint32 rgb		= step*levelNdx*face;
				const deUint32 colorA	= 0xff000000 | rgb;
				const deUint32 colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		for (int i = 0; i < 2; i++)
			m_textures[i]->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		VertexCubeTextureCase::deinit();
		throw;
	}
}